

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Integrator::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Integrator *this,Ray *ray,
          Float tMax)

{
  long in_FS_OFFSET;
  undefined1 auVar1 [64];
  
  *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
  if (((this->aggregate).
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       .bits & 0xffffffffffff) == 0) {
    auVar1 = ZEXT1264(ZEXT412(0));
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar1;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar1;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar1;
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar1;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    PrimitiveHandle::Intersect(__return_storage_ptr__,&this->aggregate,ray,tMax);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> Integrator::Intersect(const Ray &ray,
                                                        Float tMax) const {
    ++nIntersectionTests;
    DCHECK_NE(ray.d, Vector3f(0, 0, 0));
    if (aggregate)
        return aggregate.Intersect(ray, tMax);
    else
        return {};
}